

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall
smf::MidiMessage::setMessage
          (MidiMessage *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *message)

{
  pointer puVar1;
  long lVar2;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar1) {
    lVar2 = 0;
    do {
      puVar1[lVar2] =
           (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      lVar2 = lVar2 + 1;
      puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar2 < *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (int)puVar1);
  }
  return;
}

Assistant:

void MidiMessage::setMessage(const std::vector<uchar>& message) {
	this->resize(message.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = message[i];
	}
}